

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O2

Tensor * __thiscall
cnn::SimpleExecutionEngine::incremental_forward(SimpleExecutionEngine *this,VariableIndex *i)

{
  uint uVar1;
  ComputationGraph *pCVar2;
  Node *this_00;
  pointer pVVar3;
  pointer pTVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  AlignedMemoryPool *this_01;
  int iVar8;
  pointer pVVar9;
  float *pfVar10;
  undefined4 extraout_var;
  void *pvVar11;
  uint uVar12;
  ulong uVar13;
  allocator_type local_49;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  
  pCVar2 = (this->super_ExecutionEngine).cg;
  uVar12 = i->t;
  if ((ulong)((long)(pCVar2->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar2->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar12) {
    __assert_fail("i < cg.nodes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/exec.cc"
                  ,0x27,
                  "virtual const Tensor &cnn::SimpleExecutionEngine::incremental_forward(VariableIndex)"
                 );
  }
  uVar1 = (this->num_nodes_evaluated).t;
  if (uVar1 == 0) {
    fxs->used = 0;
  }
  if (uVar1 <= uVar12) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(&this->nfxs,(ulong)(uVar12 + 1));
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::vector
              (&xs,0x10,&local_49);
    uVar12 = (this->num_nodes_evaluated).t;
    while (uVar12 <= i->t) {
      this_00 = (((this->super_ExecutionEngine).cg)->nodes).
                super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12];
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                (&xs,(ulong)((long)(this_00->args).
                                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->args).
                                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
      pVVar3 = (this_00->args).
               super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar12 = 0;
      for (pVVar9 = (this_00->args).
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start; pVVar9 != pVVar3; pVVar9 = pVVar9 + 1)
      {
        uVar13 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        xs.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] =
             (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
             super__Vector_impl_data._M_start + pVVar9->t;
      }
      uVar12 = (this->num_nodes_evaluated).t;
      pTVar4 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar4[uVar12].d.bd = (this_00->dim).bd;
      uVar5 = *(undefined8 *)((this_00->dim).d + 2);
      uVar6 = *(undefined8 *)((this_00->dim).d + 4);
      uVar7 = *(undefined8 *)((this_00->dim).d + 6);
      pTVar4 = pTVar4 + uVar12;
      *(undefined8 *)(pTVar4->d).d = *(undefined8 *)(this_00->dim).d;
      *(undefined8 *)((pTVar4->d).d + 2) = uVar5;
      *(undefined8 *)((pTVar4->d).d + 4) = uVar6;
      *(undefined8 *)((pTVar4->d).d + 6) = uVar7;
      this_01 = fxs;
      uVar12 = Dim::size(&this_00->dim);
      pfVar10 = (float *)AlignedMemoryPool::allocate(this_01,(ulong)uVar12 << 2);
      (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start[(this->num_nodes_evaluated).t].v = pfVar10;
      if (pfVar10 == (float *)0x0) {
        std::operator<<((ostream *)&std::cerr,"out of memory\n");
LAB_0022c0eb:
        abort();
      }
      iVar8 = (*this_00->_vptr_Node[4])(this_00);
      if (CONCAT44(extraout_var,iVar8) == 0) {
        pvVar11 = (void *)0x0;
      }
      else {
        pvVar11 = AlignedMemoryPool::allocate(fxs,CONCAT44(extraout_var,iVar8));
        if (pvVar11 == (void *)0x0) {
          std::operator<<((ostream *)&std::cerr,"aux out of memory\n");
          goto LAB_0022c0eb;
        }
      }
      this_00->aux_mem = pvVar11;
      Node::forward(this_00,&xs,
                    (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start + (this->num_nodes_evaluated).t);
      uVar12 = (this->num_nodes_evaluated).t + 1;
      (this->num_nodes_evaluated).t = uVar12;
    }
    std::_Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::~_Vector_base
              (&xs.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>);
  }
  return (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
         super__Vector_impl_data._M_start + i->t;
}

Assistant:

const Tensor& SimpleExecutionEngine::incremental_forward(VariableIndex i) {
  assert(i < cg.nodes.size());

  // free any old memory if this is a new CG
  if (num_nodes_evaluated == 0) fxs->free();

  if (i >= num_nodes_evaluated) {
    nfxs.resize(i + 1);

    //vector<string> dummy(5, "x");
    vector<const Tensor*> xs(16);
    for (; num_nodes_evaluated <= i; ++num_nodes_evaluated) {
      const Node* node = cg.nodes[num_nodes_evaluated];
      xs.resize(node->arity());
      unsigned ai = 0;
      for (VariableIndex arg : node->args) {
        xs[ai] = &nfxs[arg];
        ++ai;
      }
      nfxs[num_nodes_evaluated].d = node->dim;
      nfxs[num_nodes_evaluated].v = static_cast<float*>(fxs->allocate(node->dim.size() * sizeof(float)));
      if (nfxs[num_nodes_evaluated].v == nullptr) {
        cerr << "out of memory\n";
        abort();
      }
      void* aux_mem = nullptr;
      size_t aux_size = node->aux_storage_size();
      if (aux_size) {
        aux_mem = fxs->allocate(aux_size);
        if (!aux_mem) {
          cerr << "aux out of memory\n";
          abort();
        }
      }
      node->aux_mem = aux_mem;
      node->forward(xs, nfxs[num_nodes_evaluated]);
    }
  }
  return nfxs[i];
}